

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_widget.cxx
# Opt level: O2

void widget_size_cb(Fl_Widget *param_1,long size)

{
  Fl_Type *pFVar1;
  Fl_Type *this;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Fl_Window *pFVar5;
  Fl_Type **ppFVar6;
  int s;
  Fl_Color c;
  Fl_Font f;
  
  bVar2 = false;
  ppFVar6 = &Fl_Type::first;
  while (pFVar1 = *ppFVar6, pFVar1 != (Fl_Type *)0x0) {
    if ((pFVar1->selected != '\0') && (iVar4 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1), iVar4 != 0))
    {
      bVar3 = !bVar2;
      bVar2 = true;
      if (bVar3) {
        set_modflag(1);
        undo_checkpoint();
      }
      this = pFVar1[1].prev;
      s = (int)size;
      *(int *)&this->field_0x4c = s;
      (*pFVar1->_vptr_Fl_Type[0x2b])(pFVar1,2,&f,&s,&c);
      Fl_Widget::redraw((Fl_Widget *)this);
      pFVar5 = Fl_Widget::window((Fl_Widget *)this);
      if (pFVar5 != (Fl_Window *)0x0) {
        pFVar5 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Widget::redraw((Fl_Widget *)pFVar5);
      }
    }
    ppFVar6 = &pFVar1->next;
  }
  return;
}

Assistant:

void widget_size_cb(Fl_Widget *, long size) {
  // Update any selected widgets...
  int changed = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    if (o->selected && o->is_widget()) {
      if (!changed) {
	changed = 1;
	set_modflag(1);
	undo_checkpoint();
      }

      Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
      w->labelsize((Fl_Font)size);
      Fl_Font f;
      int s = (int)size;
      Fl_Color c;
      ((Fl_Widget_Type *)o)->textstuff(2, f, s, c);

      w->redraw();
      // since this may be a major change, the whole window should be redrawn
      if (w->window()) w->window()->redraw();
    }
  }
}